

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 *pIVar1;
  long lVar2;
  ImGuiID id;
  ImGuiWindow *pIVar3;
  ImDrawList *this;
  ImDrawVert *pIVar4;
  ImVec2 *pIVar5;
  undefined4 uVar6;
  uint uVar7;
  ImU32 IVar8;
  ImU32 IVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ImVec2 IVar10;
  undefined7 extraout_var_01;
  float *pfVar11;
  byte bVar12;
  char cVar13;
  ImGuiContext *pIVar14;
  uint uVar15;
  long lVar16;
  ImGuiContext *g;
  ImGuiContext *out_h;
  ulong uVar17;
  bool bVar18;
  uint uVar19;
  int iVar20;
  float fVar21;
  int extraout_XMM0_Db_00;
  int iVar24;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  ImVec2 IVar22;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var_02 [12];
  undefined1 auVar23 [16];
  undefined4 extraout_XMM0_Dd_00;
  float fVar25;
  undefined4 extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float V;
  ImVec2 picker_pos;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  undefined1 local_24c [4];
  float local_248;
  float local_244;
  uint local_240;
  float local_23c;
  ImVec2 *local_238;
  float local_22c;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  ImVec2 local_218;
  float local_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  ImVec2 local_1f0;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  ImU32 local_1c4;
  ImU32 local_1c0;
  uint local_1bc;
  ImVec2 local_1b8;
  ImVec2 local_1b0;
  ImVec2 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  int local_198;
  int local_194;
  uint local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [24];
  ImVec2 local_160;
  undefined1 local_158 [8];
  ImVec2 local_150;
  undefined1 local_148 [8];
  int iStack_140;
  int iStack_13c;
  ImGuiContext *local_130;
  undefined1 local_128 [16];
  ImVec2 local_118;
  float fStack_110;
  float fStack_10c;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec4 local_f0;
  ImU32 local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  float local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar34 [16];
  
  pIVar14 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar3 = pIVar14->CurrentWindow;
  if (pIVar3->SkipItems != false) {
    bVar12 = 0;
    goto LAB_002244ce;
  }
  _fStack_1d0 = local_1d8;
  local_1d8 = (undefined1  [8])ref_col;
  this = pIVar3->DrawList;
  local_228._0_4_ = CalcItemWidth();
  local_228._4_4_ = extraout_XMM0_Db;
  uStack_220._0_4_ = extraout_XMM0_Dc;
  uStack_220._4_4_ = (float)extraout_XMM0_Dd;
  (pIVar14->NextItemData).Flags = 0;
  local_118 = (ImVec2)label;
  PushID(label);
  BeginGroup();
  uVar15 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar15);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar7 = pIVar14->ColorEditOptions & 0x6000000;
    uVar19 = 0x2000000;
    if (uVar7 != 0) {
      uVar19 = uVar7;
    }
    uVar15 = uVar15 | uVar19;
  }
  if ((uVar15 & 0x18000000) == 0) {
    uVar7 = pIVar14->ColorEditOptions & 0x18000000;
    uVar19 = 0x8000000;
    if (uVar7 != 0) {
      uVar19 = uVar7;
    }
    uVar15 = uVar15 | uVar19;
  }
  if ((uVar15 & 8) == 0) {
    uVar15 = uVar15 | pIVar14->ColorEditOptions & 0x10000U;
  }
  local_1bc = uVar15 & 0x10002;
  bVar18 = local_1bc == 0x10000;
  local_218 = (pIVar3->DC).CursorPos;
  local_238 = (ImVec2 *)col;
  local_148._0_4_ = GetFrameHeight();
  pIVar1 = local_238;
  register0x00001204 = extraout_var_02;
  fVar30 = (pIVar14->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar30);
  fVar30 = local_228._0_4_ - ((float)local_148._0_4_ + fVar30) * (float)(byte)(bVar18 + 1);
  uVar19 = -(uint)(fVar30 <= (float)local_148._0_4_);
  auVar36._0_4_ = uVar19 & local_148._0_4_;
  auVar36._4_4_ = local_228._4_4_ & extraout_var_02._0_4_;
  auVar36._8_4_ = local_228._8_4_ & extraout_var_02._4_4_;
  auVar36._12_4_ = local_228._12_4_ & extraout_var_02._8_4_;
  local_178._0_16_ = auVar36 | ZEXT416(~uVar19 & (uint)fVar30);
  local_b8 = (ulong)((uVar15 & 2) == 0) * 4 + 0xc;
  pfVar11 = (float *)0x0;
  __memcpy_chk(local_58,local_238,local_b8,0x10);
  local_22c = (float)local_178._0_4_ * 0.08;
  local_a8 = ZEXT416((uint)((float)local_178._0_4_ * 0.5));
  local_1b0.x = (float)local_178._0_4_ * 0.5 - local_22c;
  _local_c8 = ZEXT416((uint)local_1b0.x);
  local_1f0.x = ((float)local_148._0_4_ + (float)local_178._0_4_) * 0.5 + local_218.x;
  local_1f0.y = (float)local_178._0_4_ * 0.5 + local_218.y;
  local_228._0_4_ = local_218.x + (float)local_178._0_4_ + (float)local_128._0_4_;
  local_1b0.x = local_1b0.x - (float)(int)((float)local_178._0_4_ * 0.027);
  local_160.x = local_1b0.x * -0.5;
  local_160.y = local_1b0.x * -0.866025;
  local_1b0.y = 0.0;
  local_1b8.y = local_1b0.x * 0.866025;
  local_24c = (undefined1  [4])pIVar1->x;
  local_248 = pIVar1->y;
  local_244 = pIVar1[1].x;
  local_130 = pIVar14;
  local_228._4_4_ = local_218.y;
  uStack_220 = 0;
  local_1e4 = local_244;
  local_1e0 = local_248;
  local_1dc = (float)local_24c;
  local_1b8.x = local_160.x;
  if ((uVar15 >> 0x1b & 1) == 0) {
    out_h = pIVar14;
    fVar30 = (float)local_228._0_4_;
    if ((uVar15 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB((float)local_24c,local_248,local_244,&local_1dc,&local_1e0,&local_1e4);
      goto LAB_00222cee;
    }
  }
  else {
    out_h = (ImGuiContext *)local_24c;
    pfVar11 = &local_244;
    ColorConvertRGBtoHSV((float)local_24c,local_248,local_244,(float *)out_h,&local_248,pfVar11);
    pIVar14 = local_130;
    ColorEditRestoreHS(&pIVar1->x,(float *)out_h,&local_248,pfVar11);
LAB_00222cee:
    fVar30 = (float)local_228._0_4_;
  }
  local_208._4_4_ = local_148._4_4_;
  local_208._0_4_ = (float)local_148._0_4_ + fVar30;
  fStack_200 = (float)iStack_140;
  fStack_1fc = (float)iStack_13c;
  PushItemFlag(8,true);
  if ((uVar15 >> 0x1a & 1) == 0) {
    if ((uVar15 >> 0x19 & 1) == 0) {
      local_23c = 0.0;
      local_240 = 0;
      uVar17 = 0;
    }
    else {
      local_1a8.y = (float)local_178._0_4_;
      local_1a8.x = (float)local_178._0_4_;
      local_23c = 0.0;
      InvisibleButton("sv",&local_1a8,0);
      bVar18 = IsItemActive();
      if (bVar18) {
        auVar23._0_4_ = (float)local_178._0_4_ + -1.0;
        IVar22 = (pIVar14->IO).MousePos;
        auVar26._0_4_ = IVar22.x - local_218.x;
        auVar26._4_4_ = IVar22.y - local_218.y;
        auVar26._8_8_ = 0;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar36 = divps(auVar26,auVar23);
        local_244 = 1.0;
        fVar30 = auVar36._0_4_;
        fVar21 = auVar36._4_4_;
        iVar24 = -(uint)(fVar30 < 0.0);
        iVar20 = -(uint)(fVar21 < 0.0);
        auVar35._4_4_ = iVar20;
        auVar35._0_4_ = iVar24;
        auVar35._8_4_ = iVar20;
        auVar35._12_4_ = iVar20;
        auVar34._8_8_ = auVar35._8_8_;
        auVar34._4_4_ = iVar24;
        auVar34._0_4_ = iVar24;
        uVar19 = movmskpd((int)CONCAT71(extraout_var,bVar18),auVar34);
        local_248 = 0.0;
        if (((uVar19 & 1) == 0) && (local_248 = 1.0, fVar30 <= 1.0)) {
          local_248 = fVar30;
        }
        if ((uVar19 & 2) == 0) {
          auVar31 = ZEXT812(0x3f800000);
          if (fVar21 <= auVar31._0_4_) {
            auVar31._4_8_ = auVar31._4_8_;
            auVar31._0_4_ = fVar21;
          }
          local_244 = 1.0 - auVar31._0_4_;
        }
        IVar9 = pIVar14->ColorEditLastColor;
        fStack_1a0 = local_238[1].x;
        local_1a8 = *local_238;
        fStack_19c = 0.0;
        IVar8 = ColorConvertFloat4ToU32((ImVec4 *)&local_1a8);
        local_23c = (float)CONCAT71((int7)((ulong)pfVar11 >> 8),1);
        if (IVar9 == IVar8) {
          local_24c = (undefined1  [4])pIVar14->ColorEditLastHue;
        }
      }
      if ((uVar15 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_1a8.y = local_218.y;
      local_1a8.x = (float)local_228._0_4_;
      SetCursorScreenPos(&local_1a8);
      local_1a8.y = (float)local_178._0_4_;
      local_1a8.x = (float)local_148._0_4_;
      local_240 = 0;
      InvisibleButton("hue",&local_1a8,0);
      bVar18 = IsItemActive();
      if (bVar18) {
        fVar21 = ((pIVar14->IO).MousePos.y - local_218.y) / ((float)local_178._0_4_ + -1.0);
        fVar30 = 1.0;
        if (fVar21 <= 1.0) {
          fVar30 = fVar21;
        }
        local_24c = (undefined1  [4])(~-(uint)(fVar21 < 0.0) & (uint)fVar30);
        local_240 = (uint)CONCAT71(extraout_var_00,1);
        uVar17 = CONCAT71((int7)((ulong)out_h >> 8),1);
      }
      else {
        uVar17 = (ulong)(uint)local_23c;
      }
    }
  }
  else {
    local_1a8.y = (float)local_178._0_4_;
    local_1a8.x = (pIVar14->Style).ItemInnerSpacing.x + (float)local_178._0_4_ +
                  (float)local_148._0_4_;
    local_23c = 0.0;
    InvisibleButton("hsv",&local_1a8,0);
    bVar18 = IsItemActive();
    local_240 = 0;
    uVar17 = 0;
    if (bVar18) {
      fVar25 = (pIVar14->IO).MouseClickedPos[0].x - local_1f0.x;
      fVar37 = (pIVar14->IO).MouseClickedPos[0].y - local_1f0.y;
      fVar21 = (pIVar14->IO).MousePos.x - local_1f0.x;
      local_188 = ZEXT416((uint)fVar21);
      fVar30 = (pIVar14->IO).MousePos.y - local_1f0.y;
      local_88 = ZEXT416((uint)fVar30);
      local_78 = ZEXT416((uint)fVar37);
      local_d8 = ZEXT416((uint)fVar25);
      fVar25 = fVar25 * fVar25 + fVar37 * fVar37;
      if ((fVar25 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_a8._0_4_ + 1.0) * ((float)local_a8._0_4_ + 1.0) < fVar25)) {
        local_240 = 0;
      }
      else {
        fVar30 = atan2f(fVar30,fVar21);
        fVar30 = (fVar30 / 3.1415927) * 0.5;
        local_24c = (undefined1  [4])
                    (~-(uint)(fVar30 < 0.0) & (uint)fVar30 |
                    (uint)(fVar30 + 1.0) & -(uint)(fVar30 < 0.0));
        local_240 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_98 = cosf((float)local_24c * -2.0 * 3.1415927);
      fVar30 = sinf((float)local_24c * -2.0 * 3.1415927);
      uVar6 = local_d8._0_4_;
      local_d8._4_4_ = extraout_XMM0_Db_00;
      local_d8._0_4_ = fVar30;
      local_d8._8_4_ = extraout_XMM0_Dc_00;
      local_d8._12_4_ = extraout_XMM0_Dd_00;
      local_1a8.x = local_98 * (float)uVar6 + -(float)local_78._0_4_ * fVar30;
      local_1a8.y = fVar30 * (float)uVar6 + local_98 * (float)local_78._0_4_;
      bVar18 = ImTriangleContainsPoint(&local_1b0,&local_160,&local_1b8,&local_1a8);
      if (bVar18) {
        local_1a8.x = local_98 * (float)local_188._0_4_ +
                      -(float)local_88._0_4_ * (float)local_d8._0_4_;
        local_1a8.y = (float)local_d8._0_4_ * (float)local_188._0_4_ +
                      local_98 * (float)local_88._0_4_;
        bVar18 = ImTriangleContainsPoint(&local_1b0,&local_160,&local_1b8,&local_1a8);
        if (!bVar18) {
          local_1a8 = ImTriangleClosestPoint(&local_1b0,&local_160,&local_1b8,&local_1a8);
        }
        ImTriangleBarycentricCoords
                  (&local_1b0,&local_160,&local_1b8,&local_1a8,&local_f0.x,(float *)local_158,
                   &local_f8.x);
        fVar21 = 1.0 - (float)local_158._0_4_;
        fVar30 = 1.0;
        if (fVar21 <= 1.0) {
          fVar30 = fVar21;
        }
        local_244 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar30);
        fVar21 = local_f0.x / local_244;
        fVar30 = 1.0;
        if (fVar21 <= 1.0) {
          fVar30 = fVar21;
        }
        local_248 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar30);
        local_23c = (float)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar17 = 1;
      }
      else {
        local_23c = 0.0;
        uVar17 = (ulong)local_240;
      }
    }
    if ((uVar15 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_208._0_4_;
  if (local_1bc == 0x10000) {
    local_1a8.y = local_218.y;
    local_1a8.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_1a8);
    local_1a8.y = (float)local_178._0_4_;
    local_1a8.x = (float)local_148._0_4_;
    InvisibleButton("alpha",&local_1a8,0);
    bVar18 = IsItemActive();
    if (bVar18) {
      fVar21 = ((pIVar14->IO).MousePos.y - local_218.y) / ((float)local_178._0_4_ + -1.0);
      fVar30 = 1.0;
      if (fVar21 <= 1.0) {
        fVar30 = fVar21;
      }
      local_238[1].y =
           (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                  ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar30));
      uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
    }
  }
  uVar19 = (uint)uVar17;
  PopItemFlag();
  if ((uVar15 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar14->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  IVar22 = local_118;
  if ((-1 < (char)uVar15) &&
     (IVar10 = (ImVec2)FindRenderedTextEnd((char *)local_118,(char *)0x0), IVar10 != IVar22)) {
    if ((uVar15 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar14->Style).ItemInnerSpacing.x);
    }
    TextEx((char *)local_118,(char *)IVar10,0);
  }
  if ((uVar15 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_1a8 = *local_238;
    fStack_1a0 = local_238[1].x;
    if ((uVar15 & 2) == 0) {
      fStack_19c = local_238[1].y;
    }
    else {
      fStack_19c = 1.0;
    }
    if ((char)uVar15 < '\0') {
      Text("Current");
    }
    fStack_110 = (float)local_148._0_4_ * 0.0;
    fStack_10c = (float)local_148._0_4_ * 0.0;
    local_118.y = (float)local_148._0_4_ * 2.0;
    local_118.x = (float)local_148._0_4_ * 3.0;
    local_f0.y = (float)local_148._0_4_ * 2.0;
    local_f0.x = (float)local_148._0_4_ * 3.0;
    ColorButton("##current",(ImVec4 *)&local_1a8,uVar15 & 0x180e0040,(ImVec2 *)&local_f0);
    if (local_1d8 != (undefined1  [8])0x0) {
      Text("Original");
      local_f0._0_8_ = *(undefined8 *)local_1d8;
      local_f0.z = *(float *)((long)local_1d8 + 8);
      if ((uVar15 & 2) == 0) {
        local_f0.w = *(float *)((long)local_1d8 + 0xc);
      }
      else {
        local_f0.w = 1.0;
      }
      local_158._0_4_ = local_118.x;
      local_158._4_4_ = local_118.y;
      bVar18 = ColorButton("##original",&local_f0,uVar15 & 0x180e0040,(ImVec2 *)local_158);
      if (bVar18) {
        memcpy(local_238,(void *)local_1d8,local_b8);
        uVar19 = (uint)CONCAT71((int7)(uVar17 >> 8),1);
      }
    }
    local_188._0_4_ = uVar19;
    PopItemFlag();
    EndGroup();
  }
  else {
    local_188._0_4_ = uVar19;
  }
  pIVar5 = local_238;
  pfVar11 = &local_238->y;
  pIVar1 = local_238 + 1;
  if (((char)local_240 != '\0') || (local_23c._0_1_ != '\0')) {
    if ((uVar15 >> 0x1b & 1) == 0) {
      if ((uVar15 >> 0x1c & 1) != 0) {
        local_238->x = (float)local_24c;
        local_238->y = local_248;
        local_238[1].x = local_244;
      }
    }
    else {
      ColorConvertHSVtoRGB((float)local_24c,local_248,local_244,&local_238->x,pfVar11,&pIVar1->x);
      pIVar14->ColorEditLastHue = (float)local_24c;
      pIVar14->ColorEditLastSat = local_248;
      fStack_1a0 = pIVar5[1].x;
      local_1a8 = *pIVar5;
      fStack_19c = 0.0;
      IVar9 = ColorConvertFloat4ToU32((ImVec4 *)&local_1a8);
      pIVar14->ColorEditLastColor = IVar9;
    }
  }
  cVar13 = '\x01';
  fVar30 = (float)local_148._0_4_ * 0.2;
  fVar21 = 0.0;
  fVar25 = 0.0;
  fVar37 = 0.0;
  if ((uVar15 & 0x20) == 0) {
    _local_1d8 = ZEXT416((uint)((float)local_148._0_4_ * 0.2));
    fVar30 = (float)local_128._0_4_;
    if (local_1bc != 0x10000) {
      fVar30 = (float)local_228._0_4_;
    }
    PushItemWidth((fVar30 + (float)local_148._0_4_) - local_218.x);
    uVar19 = uVar15 & 0x198e001a;
    cVar13 = '\x01';
    if (((uVar15 >> 0x14 & 1) != 0 || (uVar15 & 0x600000) == 0) &&
       (bVar18 = ColorEdit4("##rgb",&local_238->x,uVar19 | 0x100004), bVar18)) {
      local_188._0_4_ = (undefined4)CONCAT71(extraout_var_01,1);
      if (local_130->ActiveId == 0) {
        cVar13 = '\x01';
      }
      else {
        cVar13 = local_130->ActiveIdAllowOverlap;
      }
    }
    if ((uVar15 >> 0x15 & 1) != 0 || (uVar15 & 0x500000) == 0) {
      bVar18 = ColorEdit4("##hsv",&local_238->x,uVar19 | 0x200004);
      local_188._0_4_ = CONCAT31(SUB43(local_188._0_4_,1),(byte)local_188._0_4_ | bVar18);
    }
    if ((uVar15 >> 0x16 & 1) != 0 || (uVar15 & 0x300000) == 0) {
      bVar18 = ColorEdit4("##hex",&local_238->x,uVar19 | 0x400004);
      local_188._0_4_ = CONCAT31(SUB43(local_188._0_4_,1),(byte)local_188._0_4_ | bVar18);
    }
    PopItemWidth();
    fVar30 = (float)local_1d8._0_4_;
    fVar21 = (float)local_1d8._4_4_;
    fVar25 = fStack_1d0;
    fVar37 = fStack_1cc;
  }
  pIVar5 = local_238;
  fVar30 = (float)(int)fVar30;
  iVar24 = (int)fVar21;
  fVar21 = (float)(int)fVar25;
  fVar25 = (float)(int)fVar37;
  if (((uVar15 >> 0x1b & 1) != 0) && (cVar13 == '\0')) {
    local_1d8._4_4_ = iVar24;
    local_1d8._0_4_ = fVar30;
    fStack_1d0 = fVar21;
    fStack_1cc = fVar25;
    ColorConvertRGBtoHSV
              (local_238->x,local_238->y,local_238[1].x,&local_1a8.x,&local_f0.x,(float *)local_158)
    ;
    if ((local_1a8.x <= 0.0) && (0.0 < (float)local_24c)) {
      if (0.0 < (float)local_158._0_4_) {
LAB_002237be:
        if (0.0 < local_f0.x) goto LAB_002237e4;
        fVar30 = local_248 * 0.5;
        fVar21 = (float)local_158._0_4_;
      }
      else {
        if ((local_244 == (float)local_158._0_4_) &&
           (!NAN(local_244) && !NAN((float)local_158._0_4_))) goto LAB_002237be;
        fVar30 = local_248;
        fVar21 = local_244 * 0.5;
      }
      ColorConvertHSVtoRGB((float)local_24c,fVar30,fVar21,&pIVar5->x,pfVar11,&pIVar1->x);
    }
LAB_002237e4:
    fVar30 = (float)local_1d8._0_4_;
    iVar24 = local_1d8._4_4_;
    fVar21 = fStack_1d0;
    fVar25 = fStack_1cc;
  }
  pIVar14 = local_130;
  uVar19 = local_188._0_4_;
  pIVar1 = local_238;
  local_68 = (float)(int)fVar30;
  fStack_64 = (float)iVar24;
  fStack_60 = (float)(int)fVar21;
  fStack_5c = (float)(int)fVar25;
  if ((char)local_188._0_4_ != '\0') {
    if ((uVar15 >> 0x1b & 1) == 0) {
      if ((uVar15 >> 0x1c & 1) != 0) {
        local_24c = (undefined1  [4])local_238->x;
        local_248 = local_238->y;
        local_244 = local_238[1].x;
        ColorConvertHSVtoRGB((float)local_24c,local_248,local_244,&local_1dc,&local_1e0,&local_1e4);
      }
    }
    else {
      local_1dc = local_238->x;
      local_1e0 = local_238->y;
      local_1e4 = local_238[1].x;
      ColorConvertRGBtoHSV(local_1dc,local_1e0,local_1e4,(float *)local_24c,&local_248,&local_244);
      uVar19 = local_188._0_4_;
      ColorEditRestoreHS(&pIVar1->x,(float *)local_24c,&local_248,&local_244);
    }
  }
  local_f0.w = (pIVar14->Style).Alpha;
  fVar30 = 1.0;
  if (local_f0.w <= 1.0) {
    fVar30 = local_f0.w;
  }
  iVar24 = (int)((float)(~-(uint)(local_f0.w < 0.0) & (uint)fVar30) * 255.0 + 0.5);
  local_f0.x = 1.0;
  local_f0.y = 1.0;
  local_f0.z = 1.0;
  uVar7 = iVar24 * 0x1000000;
  local_b0 = (ulong)uVar7;
  local_198 = uVar7 + 0xff0000;
  local_190 = iVar24 << 0x18 | 0xff;
  fStack_1a0 = (float)(iVar24 << 0x18 | 0xff00);
  fStack_19c = (float)(iVar24 << 0x18 | 0xffff00);
  local_20c = (float)(uVar7 + 0xffffff);
  local_1a8 = (ImVec2)(CONCAT44(iVar24 << 0x18,iVar24 << 0x18) | 0xffff000000ff);
  local_194 = uVar7 + 0xff00ff;
  local_1c0 = uVar7 + 0x808080;
  ColorConvertHSVtoRGB((float)local_24c,1.0,1.0,&local_f0.x,&local_f0.y,&local_f0.z);
  IVar8 = ColorConvertFloat4ToU32(&local_f0);
  local_158._4_4_ = local_1e0;
  local_158._0_4_ = local_1dc;
  local_150.y = (pIVar14->Style).Alpha;
  local_150.x = local_1e4;
  IVar9 = ColorConvertFloat4ToU32((ImVec4 *)local_158);
  fVar30 = local_20c;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  if ((uVar15 >> 0x1a & 1) == 0) {
    if ((uVar15 >> 0x19 & 1) != 0) {
      local_1d8._4_4_ = local_178._0_4_;
      local_1d8._0_4_ = local_178._0_4_;
      fStack_1d0 = (float)local_178._0_4_;
      fStack_1cc = (float)local_178._0_4_;
      local_158._0_4_ = local_218.x + (float)local_178._0_4_;
      local_158._4_4_ = local_218.y + (float)local_178._0_4_;
      local_1c4 = IVar9;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_218,(ImVec2 *)local_158,(ImU32)local_20c,IVar8,IVar8,(ImU32)local_20c);
      local_158._0_4_ = local_218.x + (float)local_1d8._0_4_;
      local_158._4_4_ = local_218.y + (float)local_1d8._4_4_;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_218,(ImVec2 *)local_158,0,0,(ImU32)local_b0,(ImU32)local_b0);
      IVar10.x = (float)local_1d8._0_4_ + local_218.x;
      IVar10.y = (float)local_1d8._4_4_ + local_218.y;
      RenderFrameBorder(local_218,IVar10,0.0);
      auVar32._4_4_ = 1.0 - local_244;
      auVar32._0_4_ = local_248;
      auVar32._8_8_ = 0;
      auVar36 = minps(_DAT_0024ea80,auVar32);
      fVar30 = local_218.x;
      fVar21 = local_218.y;
      auVar27._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_248) & auVar36._0_4_) * (float)local_1d8._0_4_
                        + fVar30 + 0.5);
      auVar27._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_244) & auVar36._4_4_) *
                        (float)local_1d8._4_4_ + fVar21 + 0.5);
      auVar27._8_4_ = (float)(int)(auVar36._8_4_ * fStack_1d0 + 0.0 + 0.0);
      auVar27._12_4_ = (float)(int)(auVar36._12_4_ * fStack_1cc + 0.0 + 0.0);
      auVar33._0_4_ = (float)local_1d8._0_4_ + fVar30 + -2.0;
      auVar33._4_4_ = (float)local_1d8._4_4_ + fVar21 + -2.0;
      auVar33._8_4_ = fStack_1d0 + 0.0 + 0.0;
      auVar33._12_4_ = fStack_1cc + 0.0 + 0.0;
      auVar36 = minps(auVar33,auVar27);
      uVar15 = -(uint)(auVar27._0_4_ < fVar30 + 2.0);
      uVar19 = -(uint)(auVar27._4_4_ < fVar21 + 2.0);
      local_f8 = (ImVec2)(CONCAT44(~uVar19 & auVar36._4_4_,~uVar15 & auVar36._0_4_) |
                         CONCAT44((uint)(fVar21 + 2.0) & uVar19,(uint)(fVar30 + 2.0) & uVar15));
      local_1d8._4_4_ = local_178._4_4_;
      local_1d8._0_4_ = (float)local_178._0_4_ / 6.0;
      fStack_1d0 = (float)local_178._8_4_;
      fStack_1cc = (float)local_178._12_4_;
      lVar16 = 0;
      do {
        lVar2 = lVar16 + 1;
        local_158._4_4_ = (float)(int)lVar16 * (float)local_1d8._0_4_ + local_218.y;
        local_158._0_4_ = local_228._0_4_;
        local_100.y = (float)(int)lVar2 * (float)local_1d8._0_4_ + local_218.y;
        local_100.x = (float)local_208._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_158,&local_100,(ImU32)(&local_1a8.x)[lVar16],
                   (ImU32)(&local_1a8.x)[lVar16],(ImU32)(&local_1a8.y)[lVar16],
                   (ImU32)(&local_1a8.y)[lVar16]);
        lVar16 = lVar2;
      } while (lVar2 != 6);
      _local_1d8 = ZEXT416((uint)(float)(int)((float)local_24c * (float)local_178._0_4_ +
                                              local_218.y + 0.5));
      p_min.y = local_218.y;
      p_min.x = (float)local_228._0_4_;
      p_max.y = (float)local_178._0_4_ + local_218.y;
      p_max.x = (float)local_208._0_4_;
      RenderFrameBorder(p_min,p_max,0.0);
      pos.x = (float)local_228._0_4_ + -1.0;
      pos.y = (float)local_1d8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar
                (this,pos,half_sz,(float)local_148._0_4_ + 2.0,(pIVar14->Style).Alpha);
      uVar19 = local_188._0_4_;
      IVar9 = local_1c4;
    }
  }
  else {
    local_d8 = ZEXT416((uint)(0.5 / (float)local_a8._0_4_));
    iVar24 = 4;
    if (4 < (int)(float)local_a8._0_4_ / 0xc) {
      iVar24 = (int)(float)local_a8._0_4_ / 0xc;
    }
    local_78._0_4_ = iVar24;
    local_88._4_4_ = -0x80000000;
    local_88._0_4_ = -(0.5 / (float)local_a8._0_4_);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_a8._0_4_ = (float)local_a8._0_4_ + (float)local_c8._0_4_;
    local_98 = (float)local_a8._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    lVar16 = 0;
    local_1c4 = IVar9;
    local_dc = IVar8;
    do {
      fVar21 = (float)(int)lVar16 / 6.0;
      fVar21 = (fVar21 + fVar21) * 3.1415927 + (float)local_88._0_4_;
      local_118.x = fVar21;
      fVar25 = ((float)(int)lVar16 + 1.0) / 6.0;
      fVar25 = (fVar25 + fVar25) * 3.1415927 + (float)local_d8._0_4_;
      local_1d8._0_4_ = fVar25;
      iVar24 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1f0,local_98,fVar21,fVar25,local_78._0_4_);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,(ImU32)fVar30,0,local_22c);
      (this->_Path).Size = 0;
      iVar20 = (this->VtxBuffer).Size;
      _local_208 = ZEXT416((uint)local_1f0.x);
      local_228._0_4_ = cosf(local_118.x);
      local_228._4_4_ = extraout_XMM0_Db_01;
      uStack_220._0_4_ = extraout_XMM0_Dc_01;
      uStack_220._4_4_ = (float)extraout_XMM0_Dd_01;
      auVar28._4_4_ = local_1f0.y;
      auVar28._0_4_ = local_208._0_4_;
      auVar28._8_4_ = local_208._4_4_;
      auVar28._12_4_ = 0;
      _local_208 = auVar28;
      fVar21 = sinf(local_118.x);
      fVar25 = (float)local_228._4_4_ * fStack_c0;
      local_228._4_4_ = fVar21 * (float)local_c8._4_4_ + (float)local_208._4_4_;
      local_228._0_4_ = (float)local_228._0_4_ * (float)local_c8._0_4_ + (float)local_208._0_4_;
      uStack_220._0_4_ = (uint)(fVar25 + fStack_200);
      uStack_220._4_4_ = extraout_XMM0_Db_02 * fStack_bc + fStack_1fc;
      _local_208 = ZEXT416((uint)local_1f0.x);
      local_118.x = cosf((float)local_1d8._0_4_);
      local_118.y = extraout_XMM0_Db_03;
      auVar29._4_4_ = local_1f0.y;
      auVar29._0_4_ = local_208._0_4_;
      auVar29._8_4_ = local_208._4_4_;
      auVar29._12_4_ = 0;
      _local_208 = auVar29;
      fStack_110 = extraout_XMM0_Dc_02;
      fStack_10c = extraout_XMM0_Dd_02;
      fVar21 = sinf((float)local_1d8._0_4_);
      IVar22.x = local_118.x * (float)local_c8._0_4_ + (float)local_208._0_4_;
      IVar22.y = fVar21 * (float)local_c8._4_4_ + (float)local_208._4_4_;
      lVar2 = lVar16 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar24,iVar20,(ImVec2)local_228,IVar22,(ImU32)(&local_1a8.x)[lVar16],
                 (ImU32)(&local_1a8.y)[lVar16]);
      lVar16 = lVar2;
    } while (lVar2 != 6);
    local_228._0_4_ = cosf(((float)local_24c + (float)local_24c) * 3.1415927);
    local_228._4_4_ = extraout_XMM0_Db_04;
    uStack_220._0_4_ = extraout_XMM0_Dc_03;
    uStack_220._4_4_ = (float)extraout_XMM0_Dd_03;
    local_208._0_4_ = sinf(((float)local_24c + (float)local_24c) * 3.1415927);
    IVar9 = local_dc;
    pIVar14 = local_130;
    fVar30 = local_20c;
    local_208._4_4_ = extraout_XMM0_Db_05;
    fStack_200 = (float)extraout_XMM0_Dc_04;
    fStack_1fc = (float)extraout_XMM0_Dd_04;
    local_158._0_4_ = (float)local_228._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1f0.x;
    local_158._4_4_ = (float)local_208._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1f0.y;
    if ((char)local_240 == '\0') {
      fVar21 = 0.55;
    }
    else {
      fVar21 = 0.65;
    }
    local_22c = local_22c * fVar21;
    iVar24 = 0x20;
    if ((int)(local_22c / 1.4) < 0x20) {
      iVar24 = (int)(local_22c / 1.4);
    }
    iVar20 = 9;
    if (9 < iVar24) {
      iVar20 = iVar24;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_158,local_22c,local_dc,iVar20);
    ImDrawList::AddCircle(this,(ImVec2 *)local_158,local_22c + 1.0,local_1c0,iVar20,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_158,local_22c,(ImU32)fVar30,iVar20,1.0);
    local_100.x = local_1b0.x * (float)local_228._0_4_ + -local_1b0.y * (float)local_208._0_4_ +
                  local_1f0.x;
    local_100.y = local_1b0.x * (float)local_208._0_4_ + local_1b0.y * (float)local_228._0_4_ +
                  local_1f0.y;
    local_38.x = local_160.x * (float)local_228._0_4_ + -local_160.y * (float)local_208._0_4_ +
                 local_1f0.x;
    local_38.y = local_160.x * (float)local_208._0_4_ + local_160.y * (float)local_228._0_4_ +
                 local_1f0.y;
    local_40.x = local_1b8.x * (float)local_228._0_4_ + -local_1b8.y * (float)local_208._0_4_ +
                 local_1f0.x;
    local_40.y = local_1b8.x * (float)local_208._0_4_ + local_1b8.y * (float)local_228._0_4_ +
                 local_1f0.y;
    IVar22 = GetFontTexUvWhitePixel();
    uStack_220 = extraout_XMM0_Qb;
    local_228._0_4_ = IVar22.x;
    local_228._4_4_ = IVar22.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar36 = _local_228;
    *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = local_100;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_228._0_4_;
    (pIVar4->uv).y = (float)local_228._4_4_;
    this->_VtxWritePtr->col = IVar9;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    *this->_IdxWritePtr = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_228._0_4_;
    (pIVar4->uv).y = (float)local_228._4_4_;
    this->_VtxWritePtr->col = IVar9;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    *this->_IdxWritePtr = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_228._0_4_;
    (pIVar4->uv).y = (float)local_228._4_4_;
    this->_VtxWritePtr->col = (ImU32)fVar30;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    *this->_IdxWritePtr = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = local_100;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_228._0_4_;
    (pIVar4->uv).y = (float)local_228._4_4_;
    this->_VtxWritePtr->col = 0;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    *this->_IdxWritePtr = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_228._0_4_;
    (pIVar4->uv).y = (float)local_228._4_4_;
    this->_VtxWritePtr->col = (ImU32)local_b0;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    *this->_IdxWritePtr = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_228._0_4_;
    (pIVar4->uv).y = (float)local_228._4_4_;
    this->_VtxWritePtr->col = 0;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_228 = auVar36;
    ImDrawList::AddTriangle(this,&local_100,&local_38,&local_40,local_1c0,1.5);
    fVar30 = 1.0;
    if (local_248 <= 1.0) {
      fVar30 = local_248;
    }
    fVar30 = (float)(~-(uint)(local_248 < 0.0) & (uint)fVar30);
    fVar25 = 1.0 - local_244;
    fVar21 = 1.0;
    if (fVar25 <= 1.0) {
      fVar21 = fVar25;
    }
    fVar21 = (float)(~-(uint)(fVar25 < 0.0) & (uint)fVar21);
    fVar25 = fVar30 * (local_100.x - local_40.x) + local_40.x;
    fVar30 = fVar30 * (local_100.y - local_40.y) + local_40.y;
    local_f8.x = fVar21 * (local_38.x - fVar25) + fVar25;
    local_f8.y = fVar21 * (local_38.y - fVar30) + fVar30;
    uVar19 = local_188._0_4_;
    IVar9 = local_1c4;
  }
  if (local_23c._0_1_ == '\0') {
    fVar30 = 6.0;
  }
  else {
    fVar30 = 10.0;
  }
  local_228._0_4_ = fVar30;
  ImDrawList::AddCircleFilled(this,&local_f8,fVar30,IVar9,0xc);
  ImDrawList::AddCircle(this,&local_f8,(float)local_228._0_4_ + 1.0,local_1c0,0xc,1.0);
  ImDrawList::AddCircle(this,&local_f8,(float)local_228._0_4_,(ImU32)local_20c,0xc,1.0);
  if (local_1bc == 0x10000) {
    fVar30 = local_238[1].y;
    _local_208 = ZEXT416((uint)fVar30);
    fVar21 = 1.0;
    if (fVar30 <= 1.0) {
      fVar21 = fVar30;
    }
    _local_228 = ZEXT416((uint)(1.0 - fVar21));
    local_158._4_4_ = local_218.y;
    local_158._0_4_ = local_128._0_4_;
    local_150.x = (float)local_128._0_4_ + (float)local_148._0_4_;
    local_150.y = local_218.y + (float)local_178._0_4_;
    RenderColorRectWithAlphaCheckerboard
              (this,(ImVec2)local_158,local_150,0,(local_150.x - (float)local_128._0_4_) * 0.5,
               (ImVec2)0x0,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_158,&local_150,IVar9,IVar9,IVar9 & 0xffffff,IVar9 & 0xffffff);
    local_228._4_4_ = (float)(int)(float)(~local_208._4_4_ & local_228._4_4_);
    local_228._0_4_ =
         (float)(int)((float)(-(uint)((float)local_208._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_208._0_4_ < 0.0) & local_228._0_4_) *
                      (float)local_178._0_4_ + local_218.y + 0.5);
    uStack_220._0_4_ = (uint)(float)(int)(float)(~(uint)fStack_200 & (uint)uStack_220);
    uStack_220._4_4_ = (float)(int)(float)(~(uint)fStack_1fc & (uint)uStack_220._4_4_);
    RenderFrameBorder((ImVec2)local_158,local_150,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_228._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar
              (this,pos_00,half_sz_00,(float)local_148._0_4_ + 2.0,(pIVar14->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar19 != '\0') {
    iVar24 = bcmp(local_58,local_238,local_b8);
    uVar19 = uVar19 & 0xff;
    if (iVar24 == 0) {
      uVar19 = 0;
    }
  }
  bVar12 = (byte)uVar19;
  if (((uVar19 & 1) != 0) && (id = (pIVar14->LastItemData).ID, id != 0)) {
    MarkItemEdited(id);
  }
  PopID();
LAB_002244ce:
  return (bool)(bVar12 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed && g.LastItemData.ID != 0) // In case of ID collision, the second EndGroup() won't catch g.ActiveId
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}